

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlDOMWrapAdoptNode(xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,
                       xmlDocPtr destDoc,xmlNodePtr destParent,int options)

{
  xmlChar *str2;
  _xmlNs **pp_Var1;
  xmlNodePtr pxVar2;
  xmlElementType xVar3;
  int iVar4;
  int iVar5;
  xmlNsPtr pxVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  _xmlDict *p_Var9;
  xmlNsMapItemPtr_conflict pxVar10;
  xmlEntityPtr pxVar11;
  xmlNodePtr pxVar12;
  _xmlNode *p_Var13;
  xmlNsPtr *ppxVar14;
  xmlNsMapItemPtr_conflict pxVar15;
  _xmlNode *p_Var16;
  _xmlDoc *p_Var17;
  int iVar18;
  xmlChar *old_2;
  _xmlDoc *doc;
  xmlNodePtr node_00;
  xmlNodePtr pxVar19;
  xmlNsMapItemPtr pxVar20;
  xmlNs *pxVar21;
  bool bVar22;
  int in_stack_ffffffffffffff80;
  xmlNsMapPtr nsMap;
  xmlDOMWrapCtxtPtr_conflict local_68;
  undefined8 local_60;
  xmlChar *old;
  undefined4 local_4c;
  xmlNsPtr local_48;
  undefined8 local_40;
  xmlNodePtr local_38;
  
  if (node == (xmlNodePtr)0x0) {
    return -1;
  }
  xVar3 = node->type;
  if (destDoc == (xmlDocPtr)0x0 || xVar3 == XML_NAMESPACE_DECL) {
    return -1;
  }
  if ((destParent != (xmlNodePtr)0x0) && (destParent->doc != destDoc)) {
    return -1;
  }
  doc = node->doc;
  if ((doc != sourceDoc && doc != (_xmlDoc *)0x0) && sourceDoc != (xmlDocPtr)0x0) {
    return -1;
  }
  if (sourceDoc != (xmlDocPtr)0x0) {
    doc = sourceDoc;
  }
  if (doc == destDoc) {
    return -1;
  }
  if (XML_DOCUMENT_FRAG_NODE < xVar3) {
    return 1;
  }
  if ((0x1beU >> (xVar3 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
    if (xVar3 != XML_DOCUMENT_FRAG_NODE) {
      return 1;
    }
    return 2;
  }
  pxVar19 = destParent;
  if (node->parent != destParent && node->parent != (_xmlNode *)0x0) {
    xmlUnlinkNode(node);
    xVar3 = node->type;
  }
  p_Var9 = (_xmlDict *)(ulong)xVar3;
  if (xVar3 != XML_ATTRIBUTE_NODE) {
    if (xVar3 != XML_ELEMENT_NODE) {
      node->doc = destDoc;
      if (doc == (xmlDocPtr)0x0) {
        bVar22 = false;
      }
      else {
        bVar22 = doc->dict == destDoc->dict;
      }
      if (xVar3 - XML_TEXT_NODE < 2) {
        if (bVar22) {
          return 0;
        }
      }
      else {
        if (xVar3 == XML_ENTITY_REF_NODE) {
          node->content = (xmlChar *)0x0;
          node->children = (_xmlNode *)0x0;
          node->last = (_xmlNode *)0x0;
          if (((destDoc->intSubset != (_xmlDtd *)0x0) || (destDoc->extSubset != (_xmlDtd *)0x0)) &&
             (pxVar11 = xmlGetDocEntity(destDoc,node->name), pxVar11 != (xmlEntityPtr)0x0)) {
            node->content = pxVar11->content;
            node->children = (_xmlNode *)pxVar11;
            node->last = (_xmlNode *)pxVar11;
          }
          if (bVar22) {
            return 0;
          }
          pxVar8 = node->name;
          if (pxVar8 == (xmlChar *)0x0) {
            return 0;
          }
          if (destDoc->dict == (xmlDictPtr)0x0) {
            if (doc == (xmlDocPtr)0x0) {
              return 0;
            }
            if (doc->dict != (xmlDictPtr)0x0) {
              iVar18 = xmlDictOwns(doc->dict,pxVar8);
              if (iVar18 != 0) {
                pxVar8 = xmlStrdup(node->name);
                node->name = pxVar8;
                return 0;
              }
              return 0;
            }
            return 0;
          }
          pxVar7 = xmlDictLookup(destDoc->dict,pxVar8,-1);
          node->name = pxVar7;
          if (((doc != (xmlDocPtr)0x0) && (doc->dict != (xmlDictPtr)0x0)) &&
             (iVar18 = xmlDictOwns(doc->dict,pxVar8), iVar18 != 0)) {
            return 0;
          }
          (*xmlFree)(pxVar8);
          return 0;
        }
        if (xVar3 != XML_PI_NODE) {
          return 0;
        }
        if (bVar22) {
          return 0;
        }
        pxVar8 = node->name;
        if (pxVar8 != (xmlChar *)0x0) {
          if (destDoc->dict == (xmlDictPtr)0x0) {
            if (doc == (xmlDocPtr)0x0) {
              return 0;
            }
            if ((doc->dict != (xmlDictPtr)0x0) &&
               (iVar18 = xmlDictOwns(doc->dict,pxVar8), iVar18 != 0)) {
              pxVar8 = xmlStrdup(node->name);
              node->name = pxVar8;
            }
          }
          else {
            pxVar7 = xmlDictLookup(destDoc->dict,pxVar8,-1);
            node->name = pxVar7;
            if (((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) ||
               (iVar18 = xmlDictOwns(doc->dict,pxVar8), iVar18 == 0)) {
              (*xmlFree)(pxVar8);
            }
          }
        }
      }
      if (node->content == (xmlChar *)0x0 || doc == (xmlDocPtr)0x0) {
        return 0;
      }
      if (doc->dict != (xmlDictPtr)0x0) {
        iVar18 = xmlDictOwns(doc->dict,node->content);
        if (iVar18 != 0) {
          if (destDoc->dict == (xmlDictPtr)0x0) {
            pxVar8 = xmlStrdup(node->content);
          }
          else {
            pxVar8 = xmlDictLookup(destDoc->dict,node->content,-1);
          }
          node->content = pxVar8;
          return 0;
        }
        return 0;
      }
      return 0;
    }
    nsMap = (xmlNsMapPtr)0x0;
    local_48 = (xmlNsPtr)0x0;
    if ((doc == (xmlDocPtr)0x0) || (p_Var9 = doc->dict, p_Var9 != destDoc->dict)) {
      local_40 = (xmlNodePtr)((ulong)local_40._4_4_ << 0x20);
    }
    else {
      p_Var9 = (_xmlDict *)CONCAT71((int7)((ulong)p_Var9 >> 8),1);
      local_40 = (xmlNodePtr)CONCAT44(local_40._4_4_,(int)p_Var9);
    }
    if (ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) {
      if (destParent != (xmlNodePtr)0x0) {
LAB_00185178:
        local_4c = 0;
        local_60 = (xmlNodePtr)((ulong)local_60._4_4_ << 0x20);
        goto LAB_00185194;
      }
LAB_0018518a:
      local_4c = (undefined4)CONCAT71((int7)((ulong)p_Var9 >> 8),1);
    }
    else {
      p_Var9 = (_xmlDict *)ctxt->namespaceMap;
      nsMap = (xmlNsMapPtr)p_Var9;
      if (destParent == (xmlNodePtr)0x0) goto LAB_0018518a;
      if (ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0) goto LAB_00185178;
      local_4c = 0;
    }
    local_60 = (xmlNodePtr)CONCAT44(local_60._4_4_,1);
LAB_00185194:
    iVar18 = -1;
    local_38 = (xmlNodePtr)0x0;
    p_Var13 = node;
    local_68 = ctxt;
LAB_001851ad:
    p_Var16 = p_Var13;
    if (p_Var13->doc == doc) {
      xVar3 = p_Var13->type;
    }
    else {
      if (p_Var13->next == (xmlNodePtr)0x0) goto LAB_00185757;
      pxVar19 = p_Var13->next;
      do {
        p_Var16 = pxVar19;
        xVar3 = p_Var16->type;
        if (xVar3 == XML_XINCLUDE_END) break;
        if (p_Var16->doc == node->doc) goto LAB_001851f7;
        pxVar19 = p_Var16->next;
      } while (p_Var16->next != (_xmlNode *)0x0);
      if (p_Var16->doc != node->doc) goto LAB_00185757;
    }
LAB_001851f7:
    p_Var16->doc = destDoc;
    iVar5 = -1;
    switch(xVar3) {
    case XML_ELEMENT_NODE:
      iVar18 = iVar18 + 1;
      if ((p_Var16->nsDef != (xmlNs *)0x0) &&
         ((local_68 == (xmlDOMWrapCtxtPtr_conflict)0x0 ||
          (local_68->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0)))) {
        if ((int)local_60 == 0) {
          iVar4 = xmlDOMWrapNSNormGatherInScopeNs(&nsMap,destParent);
          local_60 = (xmlNodePtr)CONCAT44(local_60._4_4_,1);
          iVar5 = -1;
          if (iVar4 == -1) goto switchD_00185214_caseD_6;
        }
        local_48 = (xmlNsPtr)&p_Var16->nsDef;
        while (pp_Var1 = &local_48->next, local_48 = *pp_Var1, *pp_Var1 != (xmlNsPtr)0x0) {
          if ((nsMap != (xmlNsMapPtr)0x0) &&
             (pxVar10 = nsMap->first, pxVar10 != (xmlNsMapItemPtr_conflict)0x0)) {
            for (; pxVar10 != (xmlNsMapItemPtr_conflict)0x0; pxVar10 = pxVar10->next) {
              if ((-2 < pxVar10->depth) && (pxVar10->shadowDepth == -1)) {
                pxVar8 = pxVar10->newNs->prefix;
                if ((local_48->prefix == pxVar8) ||
                   (iVar5 = xmlStrEqual(local_48->prefix,pxVar8), iVar5 != 0)) {
                  pxVar10->shadowDepth = iVar18;
                }
              }
            }
          }
          iVar5 = -1;
          pxVar10 = xmlDOMWrapNsMapAddItem(&nsMap,-1,local_48,local_48,iVar18);
          if (pxVar10 == (xmlNsMapItemPtr_conflict)0x0) goto switchD_00185214_caseD_6;
        }
      }
      local_38 = p_Var16;
    case XML_ATTRIBUTE_NODE:
      if (p_Var16->ns != (xmlNs *)0x0) {
        iVar5 = -1;
        if ((int)local_60 == 0) {
          iVar4 = xmlDOMWrapNSNormGatherInScopeNs(&nsMap,destParent);
          local_60 = (xmlNodePtr)CONCAT44(local_60._4_4_,1);
          if (iVar4 != -1) goto LAB_00185329;
switchD_00185214_caseD_6:
          if (nsMap == (xmlNsMapPtr)0x0) {
            return iVar5;
          }
          if (local_68 == (xmlDOMWrapCtxtPtr_conflict)0x0) goto LAB_0018580d;
        }
        else {
LAB_00185329:
          if ((nsMap != (xmlNsMapPtr)0x0) &&
             (pxVar10 = nsMap->first, pxVar10 != (xmlNsMapItemPtr_conflict)0x0)) {
            for (; pxVar10 != (xmlNsMapItemPtr_conflict)0x0; pxVar10 = pxVar10->next) {
              if ((pxVar10->shadowDepth == -1) && (p_Var16->ns == pxVar10->oldNs)) {
                ppxVar14 = &pxVar10->newNs;
                goto LAB_001855b0;
              }
            }
          }
          if (local_68 == (xmlDOMWrapCtxtPtr)0x0) {
            pxVar6 = p_Var16->ns;
LAB_00185568:
            pxVar19 = local_38;
            if ((char)local_4c != '\0') {
              pxVar19 = (xmlNodePtr)0x0;
            }
            iVar4 = xmlDOMWrapNSNormAcquireNormalizedNs
                              (destDoc,pxVar19,pxVar6,&local_48,&nsMap,iVar18,
                               (uint)(p_Var16->type == XML_ATTRIBUTE_NODE),in_stack_ffffffffffffff80
                              );
            ppxVar14 = &local_48;
            if (iVar4 != -1) {
LAB_001855b0:
              p_Var16->ns = *ppxVar14;
              goto LAB_001855b7;
            }
            goto switchD_00185214_caseD_6;
          }
          pxVar6 = p_Var16->ns;
          if (local_68->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0) goto LAB_00185568;
          local_48 = (*local_68->getNsForNodeFunc)(local_68,p_Var16,pxVar6->href,pxVar6->prefix);
          pxVar10 = xmlDOMWrapNsMapAddItem(&nsMap,-1,p_Var16->ns,local_48,-4);
          ppxVar14 = &local_48;
          if (pxVar10 != (xmlNsMapItemPtr_conflict)0x0) goto LAB_001855b0;
          iVar5 = -1;
          if (nsMap == (xmlNsMapPtr)0x0) {
            return -1;
          }
        }
        if ((xmlNsMapPtr)local_68->namespaceMap == nsMap) {
          pxVar10 = nsMap->first;
          if (pxVar10 != (xmlNsMapItemPtr_conflict)0x0) {
            if (nsMap->pool != (xmlNsMapItemPtr_conflict)0x0) {
              nsMap->last->next = nsMap->pool;
              pxVar10 = nsMap->first;
            }
            nsMap->pool = pxVar10;
            nsMap->first = (xmlNsMapItemPtr_conflict)0x0;
            return iVar5;
          }
          return iVar5;
        }
LAB_0018580d:
        xmlDOMWrapNsMapFree(nsMap);
        return iVar5;
      }
LAB_001855b7:
      if (((char)local_40 == '\0') && (pxVar8 = p_Var16->name, pxVar8 != (xmlChar *)0x0)) {
        if (destDoc->dict != (xmlDictPtr)0x0) {
          old = pxVar8;
          pxVar8 = xmlDictLookup(destDoc->dict,pxVar8,-1);
          p_Var16->name = pxVar8;
          if (((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) ||
             (iVar5 = xmlDictOwns(doc->dict,old), iVar5 == 0)) {
            (*xmlFree)(old);
          }
          goto LAB_00185636;
        }
        if (doc != (xmlDocPtr)0x0) {
          if ((doc->dict != (xmlDictPtr)0x0) && (iVar5 = xmlDictOwns(doc->dict,pxVar8), iVar5 != 0))
          {
            pxVar8 = xmlStrdup(p_Var16->name);
            p_Var16->name = pxVar8;
          }
          goto LAB_00185636;
        }
        if (p_Var16->type != XML_ELEMENT_NODE) goto LAB_00185678;
      }
      else {
LAB_00185636:
        if (p_Var16->type != XML_ELEMENT_NODE) {
          if ((doc != (xmlDocPtr)0x0) && (*(int *)&p_Var16->content == 2)) {
            xmlRemoveID(doc,(xmlAttrPtr)p_Var16);
          }
LAB_00185678:
          *(undefined4 *)&p_Var16->content = 0;
          p_Var16->properties = (_xmlAttr *)0x0;
          goto switchD_00185214_caseD_8;
        }
      }
      p_Var16->psvi = (void *)0x0;
      p_Var16->line = 0;
      p_Var16->extra = 0;
      p_Var13 = (_xmlNode *)p_Var16->properties;
      if (p_Var13 != (xmlNodePtr)0x0) goto LAB_001851ad;
switchD_00185214_caseD_8:
      while (p_Var13 = p_Var16->children, p_Var13 == (_xmlNode *)0x0) {
LAB_00185757:
        do {
          if (p_Var16 == node) {
            iVar5 = 0;
            goto switchD_00185214_caseD_6;
          }
          xVar3 = p_Var16->type;
          if ((xVar3 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
             ((0x180002U >> (xVar3 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
            if ((nsMap != (xmlNsMapPtr)0x0) && (nsMap->first != (xmlNsMapItemPtr_conflict)0x0)) {
              while ((pxVar10 = nsMap->last, pxVar15 = (xmlNsMapItemPtr_conflict)nsMap,
                     pxVar10 != (xmlNsMapItemPtr_conflict)0x0 && (iVar18 <= pxVar10->depth))) {
                pxVar20 = pxVar10->prev;
                nsMap->last = pxVar20;
                if (pxVar20 == (xmlNsMapItemPtr)0x0) {
                  pxVar20 = (xmlNsMapItemPtr)nsMap;
                }
                pxVar20->next = (xmlNsMapItemPtr_conflict)0x0;
                pxVar10->next = nsMap->pool;
                nsMap->pool = pxVar10;
              }
              while (pxVar15 = pxVar15->next, pxVar15 != (xmlNsMapItemPtr_conflict)0x0) {
                if (iVar18 <= pxVar15->shadowDepth) {
                  pxVar15->shadowDepth = -1;
                }
              }
            }
            iVar18 = iVar18 + -1;
          }
          p_Var13 = p_Var16->next;
          if (p_Var13 != (_xmlNode *)0x0) goto LAB_001851ad;
          p_Var16 = p_Var16->parent;
        } while (xVar3 != XML_ATTRIBUTE_NODE);
      }
      goto LAB_001851ad;
    case XML_TEXT_NODE:
    case XML_CDATA_SECTION_NODE:
      goto switchD_00185214_caseD_3;
    case XML_ENTITY_REF_NODE:
      p_Var16->content = (xmlChar *)0x0;
      p_Var16->children = (_xmlNode *)0x0;
      p_Var16->last = (_xmlNode *)0x0;
      if ((destDoc->intSubset == (_xmlDtd *)0x0) && (destDoc->extSubset == (_xmlDtd *)0x0))
      goto LAB_00185757;
      pxVar11 = xmlGetDocEntity(destDoc,p_Var16->name);
      if (pxVar11 == (xmlEntityPtr)0x0) goto LAB_00185757;
      p_Var16->content = pxVar11->content;
      p_Var16->children = (_xmlNode *)pxVar11;
      p_Var16->last = (_xmlNode *)pxVar11;
      goto LAB_00185757;
    default:
      goto switchD_00185214_caseD_6;
    case XML_PI_NODE:
      if ((char)local_40 == '\0') {
        pxVar8 = p_Var16->name;
        if (pxVar8 != (xmlChar *)0x0) {
          if (destDoc->dict == (xmlDictPtr)0x0) {
            if (doc == (xmlDocPtr)0x0) goto switchD_00185214_caseD_8;
            if ((doc->dict != (xmlDictPtr)0x0) &&
               (iVar5 = xmlDictOwns(doc->dict,pxVar8), iVar5 != 0)) {
              pxVar8 = xmlStrdup(p_Var16->name);
              p_Var16->name = pxVar8;
            }
          }
          else {
            old = pxVar8;
            pxVar8 = xmlDictLookup(destDoc->dict,pxVar8,-1);
            p_Var16->name = pxVar8;
            if (((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) ||
               (iVar5 = xmlDictOwns(doc->dict,old), iVar5 == 0)) {
              (*xmlFree)(old);
            }
          }
        }
        if (((doc != (xmlDocPtr)0x0) && (p_Var16->content != (xmlChar *)0x0)) &&
           ((doc->dict != (xmlDictPtr)0x0 &&
            (iVar5 = xmlDictOwns(doc->dict,p_Var16->content), iVar5 != 0)))) {
          if (destDoc->dict == (xmlDictPtr)0x0) {
            pxVar8 = xmlStrdup(p_Var16->content);
          }
          else {
            pxVar8 = xmlDictLookup(destDoc->dict,p_Var16->content,-1);
          }
          p_Var16->content = pxVar8;
        }
      }
    case XML_COMMENT_NODE:
      goto switchD_00185214_caseD_8;
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      return -1;
    }
  }
  node->doc = destDoc;
  pxVar21 = node->ns;
  if (pxVar21 == (xmlNs *)0x0) goto LAB_00185832;
  pxVar8 = pxVar21->prefix;
  if ((((pxVar8 == (xmlChar *)0x0) || (*pxVar8 != 'x')) || (pxVar8[1] != 'm')) ||
     ((pxVar8[2] != 'l' || (pxVar8[3] != '\0')))) {
    pxVar7 = pxVar21->href;
    if (destParent == (xmlNodePtr)0x0) {
      pxVar6 = xmlDOMWrapStoreNs(destDoc,pxVar7,pxVar8);
    }
    else {
      if (pxVar7 == (xmlChar *)0x0) {
        return -1;
      }
      if (destParent->type == XML_NAMESPACE_DECL) {
        return -1;
      }
      iVar18 = xmlStrEqual(pxVar7,(xmlChar *)"http://www.w3.org/XML/1998/namespace");
      if (iVar18 == 0) {
        local_40 = (xmlNodePtr)0x0;
        p_Var17 = (_xmlDoc *)destParent;
        node_00 = (xmlNodePtr)0x0;
        local_68 = (xmlDOMWrapCtxtPtr_conflict)pxVar7;
        do {
          iVar18 = (int)pxVar19;
          xVar3 = ((xmlNodePtr)p_Var17)->type;
          pxVar8 = (xmlChar *)(ulong)xVar3;
          pxVar12 = node_00;
          pxVar2 = local_40;
          if (xVar3 == XML_ELEMENT_NODE) {
            pxVar6 = ((xmlNodePtr)p_Var17)->nsDef;
            local_60 = (xmlNodePtr)p_Var17;
            if (pxVar6 != (xmlNsPtr)0x0) {
              for (; pxVar12 = local_60, p_Var17 = (_xmlDoc *)local_60, pxVar2 = node_00,
                  pxVar6 != (xmlNsPtr)0x0; pxVar6 = pxVar6->next) {
                if (pxVar6->prefix != (xmlChar *)0x0) {
                  if (node_00 != (xmlNodePtr)0x0) {
                    pxVar21 = node_00->nsDef;
                    do {
                      pxVar7 = pxVar21->prefix;
                      str2 = pxVar6->prefix;
                      if ((pxVar7 == str2) ||
                         (((pxVar7 != (xmlChar *)0x0 && (str2 != (xmlChar *)0x0)) &&
                          (iVar18 = xmlStrEqual(pxVar7,str2), iVar18 != 0)))) goto LAB_00185b6a;
                      pxVar21 = pxVar21->next;
                    } while (pxVar21 != (_xmlNs *)0x0);
                  }
                  if (((xmlDOMWrapCtxtPtr_conflict)pxVar6->href == local_68) ||
                     (iVar18 = xmlStrEqual((xmlChar *)local_68,pxVar6->href), iVar18 != 0)) {
                    if (local_40 == (xmlNodePtr)0x0) goto LAB_0018582e;
                    iVar5 = xmlNsInScope((xmlDocPtr)destParent,node_00,(xmlNodePtr)pxVar6->prefix,
                                         pxVar8);
                    iVar18 = 0;
                    if (iVar5 == 0) {
                      iVar18 = 6;
                    }
                    pxVar8 = (xmlChar *)0x1;
                    if (iVar5 < 0) {
                      iVar18 = 1;
                    }
                    if (iVar18 != 6) {
                      if (iVar18 != 0) {
                        return -1;
                      }
                      goto LAB_0018582e;
                    }
                  }
                }
LAB_00185b6a:
              }
            }
          }
          else if ((xVar3 == XML_ENTITY_NODE) || (xVar3 == XML_ENTITY_DECL)) goto LAB_00185ba3;
          local_40 = pxVar2;
          iVar18 = (int)pxVar19;
          p_Var17 = (_xmlDoc *)((xmlNodePtr)p_Var17)->parent;
          if ((p_Var17 == (_xmlDoc *)0x0) || (node_00 = pxVar12, p_Var17->doc == p_Var17))
          goto LAB_00185ba3;
        } while( true );
      }
      pxVar6 = xmlTreeEnsureXMLDecl(destDoc);
    }
  }
  else {
    pxVar6 = xmlTreeEnsureXMLDecl(destDoc);
  }
joined_r0x00185030:
  if (pxVar6 == (xmlNsPtr)0x0) {
    return -1;
  }
LAB_0018582e:
  node->ns = pxVar6;
LAB_00185832:
  pxVar8 = node->name;
  if (pxVar8 != (xmlChar *)0x0) {
    if (destDoc->dict == (xmlDictPtr)0x0) {
      if (((doc != (xmlDocPtr)0x0) && (doc->dict != (xmlDictPtr)0x0)) &&
         (iVar18 = xmlDictOwns(doc->dict,pxVar8), iVar18 != 0)) {
        pxVar8 = xmlStrdup(node->name);
        node->name = pxVar8;
      }
    }
    else {
      pxVar7 = xmlDictLookup(destDoc->dict,pxVar8,-1);
      node->name = pxVar7;
      if (((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) ||
         (iVar18 = xmlDictOwns(doc->dict,pxVar8), iVar18 == 0)) {
        (*xmlFree)(pxVar8);
      }
    }
  }
  *(undefined4 *)&node->content = 0;
  node->properties = (_xmlAttr *)0x0;
  p_Var13 = node->children;
  if (p_Var13 == (_xmlNode *)0x0) {
    return 0;
  }
  xVar3 = p_Var13->type;
  if (xVar3 == XML_NAMESPACE_DECL) {
    return -1;
  }
  do {
    p_Var13->doc = destDoc;
    if (xVar3 - XML_TEXT_NODE < 2) {
      if ((((doc != (xmlDocPtr)0x0) && (p_Var13->content != (xmlChar *)0x0)) &&
          (doc->dict != (xmlDictPtr)0x0)) &&
         (iVar18 = xmlDictOwns(doc->dict,p_Var13->content), iVar18 != 0)) {
        if (destDoc->dict == (xmlDictPtr)0x0) {
          pxVar8 = xmlStrdup(p_Var13->content);
        }
        else {
          pxVar8 = xmlDictLookup(destDoc->dict,p_Var13->content,-1);
        }
        p_Var13->content = pxVar8;
      }
    }
    else if (xVar3 == XML_ENTITY_REF_NODE) {
      p_Var13->content = (xmlChar *)0x0;
      p_Var13->children = (_xmlNode *)0x0;
      p_Var13->last = (_xmlNode *)0x0;
      if (((destDoc->intSubset != (_xmlDtd *)0x0) || (destDoc->extSubset != (_xmlDtd *)0x0)) &&
         (pxVar11 = xmlGetDocEntity(destDoc,p_Var13->name), pxVar11 != (xmlEntityPtr)0x0)) {
        p_Var13->content = pxVar11->content;
        p_Var13->children = (_xmlNode *)pxVar11;
        p_Var13->last = (_xmlNode *)pxVar11;
      }
    }
    p_Var16 = p_Var13->children;
    if (p_Var16 == (_xmlNode *)0x0) {
      while( true ) {
        if (p_Var13 == node) {
          return 0;
        }
        p_Var16 = p_Var13->next;
        if (p_Var16 != (_xmlNode *)0x0) break;
        p_Var13 = p_Var13->parent;
      }
    }
    xVar3 = p_Var16->type;
    p_Var13 = p_Var16;
  } while( true );
LAB_00185ba3:
  pxVar6 = xmlDOMWrapNSNormDeclareNsForced
                     ((xmlDocPtr)destParent,(xmlNodePtr)node->ns->href,node->ns->prefix,
                      (xmlChar *)0x1,iVar18);
  goto joined_r0x00185030;
switchD_00185214_caseD_3:
  if ((char)local_40 != '\0') goto LAB_00185757;
  if (doc == (xmlDocPtr)0x0) goto LAB_00185757;
  if (p_Var16->content == (xmlChar *)0x0) goto LAB_00185757;
  if (doc->dict == (xmlDictPtr)0x0) goto LAB_00185757;
  iVar5 = xmlDictOwns(doc->dict,p_Var16->content);
  if (iVar5 == 0) goto LAB_00185757;
  if (destDoc->dict == (xmlDictPtr)0x0) {
    pxVar8 = xmlStrdup(p_Var16->content);
  }
  else {
    pxVar8 = xmlDictLookup(destDoc->dict,p_Var16->content,-1);
  }
  p_Var16->content = pxVar8;
  goto LAB_00185757;
}

Assistant:

int
xmlDOMWrapAdoptNode(xmlDOMWrapCtxtPtr ctxt,
		    xmlDocPtr sourceDoc,
		    xmlNodePtr node,
		    xmlDocPtr destDoc,
		    xmlNodePtr destParent,
		    int options)
{
    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL) ||
        (destDoc == NULL) ||
	((destParent != NULL) && (destParent->doc != destDoc)))
	return(-1);
    /*
    * Check node->doc sanity.
    */
    if ((node->doc != NULL) && (sourceDoc != NULL) &&
	(node->doc != sourceDoc)) {
	/*
	* Might be an XIncluded node.
	*/
	return (-1);
    }
    if (sourceDoc == NULL)
	sourceDoc = node->doc;
    if (sourceDoc == destDoc)
	return (-1);
    switch (node->type) {
	case XML_ELEMENT_NODE:
	case XML_ATTRIBUTE_NODE:
	case XML_TEXT_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_ENTITY_REF_NODE:
	case XML_PI_NODE:
	case XML_COMMENT_NODE:
	    break;
	case XML_DOCUMENT_FRAG_NODE:
	    /* TODO: Support document-fragment-nodes. */
	    return (2);
	default:
	    return (1);
    }
    /*
    * Unlink only if @node was not already added to @destParent.
    */
    if ((node->parent != NULL) && (destParent != node->parent))
	xmlUnlinkNode(node);

    if (node->type == XML_ELEMENT_NODE) {
	    return (xmlDOMWrapAdoptBranch(ctxt, sourceDoc, node,
		    destDoc, destParent, options));
    } else if (node->type == XML_ATTRIBUTE_NODE) {
	    return (xmlDOMWrapAdoptAttr(ctxt, sourceDoc,
		(xmlAttrPtr) node, destDoc, destParent, options));
    } else {
	xmlNodePtr cur = node;
	int adoptStr = 1;

	cur->doc = destDoc;
	/*
	* Optimize string adoption.
	*/
	if ((sourceDoc != NULL) &&
	    (sourceDoc->dict == destDoc->dict))
		adoptStr = 0;
	switch (node->type) {
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		XML_TREE_ADOPT_STR_2(node->content)
		    break;
	    case XML_ENTITY_REF_NODE:
		/*
		* Remove reference to the entity-node.
		*/
		node->content = NULL;
		node->children = NULL;
		node->last = NULL;
		if ((destDoc->intSubset) || (destDoc->extSubset)) {
		    xmlEntityPtr ent;
		    /*
		    * Assign new entity-node if available.
		    */
		    ent = xmlGetDocEntity(destDoc, node->name);
		    if (ent != NULL) {
			node->content = ent->content;
			node->children = (xmlNodePtr) ent;
			node->last = (xmlNodePtr) ent;
		    }
		}
		XML_TREE_ADOPT_STR(node->name)
		break;
	    case XML_PI_NODE: {
		XML_TREE_ADOPT_STR(node->name)
		XML_TREE_ADOPT_STR_2(node->content)
		break;
	    }
	    default:
		break;
	}
    }
    return (0);
}